

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckInputAttributes(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  bool bVar2;
  Bool BVar3;
  int iVar4;
  AttVal *pAVar5;
  ctmbstr cp;
  char *pcVar6;
  
  pAVar5 = node->attributes;
  if (pAVar5 != (AttVal *)0x0) {
    bVar1 = false;
    bVar2 = false;
    do {
      if (((pAVar5->dict != (Attribute *)0x0) && (pAVar5->dict->id == TidyAttr_TYPE)) &&
         (pcVar6 = pAVar5->value, pcVar6 != (char *)0x0)) {
        do {
          if (*pcVar6 == '\0') goto LAB_001556e6;
          BVar3 = prvTidyIsWhite((int)*pcVar6);
          pcVar6 = pcVar6 + 1;
        } while (BVar3 != no);
        if ((0xfffffffc < (doc->access).PRIORITYCHK - 4U) && (pAVar5->value != (ctmbstr)0x0)) {
          iVar4 = prvTidytmbstrcasecmp(pAVar5->value,"image");
          if (iVar4 == 0) {
            bVar1 = true;
          }
        }
      }
LAB_001556e6:
      if (((pAVar5->dict != (Attribute *)0x0) && (pAVar5->dict->id == TidyAttr_ALT)) &&
         (pcVar6 = pAVar5->value, pcVar6 != (char *)0x0)) {
        do {
          if (*pcVar6 == '\0') goto LAB_00155719;
          BVar3 = prvTidyIsWhite((int)*pcVar6);
          pcVar6 = pcVar6 + 1;
        } while (BVar3 != no);
        bVar2 = true;
      }
LAB_00155719:
      pAVar5 = pAVar5->next;
    } while (pAVar5 != (AttVal *)0x0);
    if (!bVar2 && bVar1) {
      prvTidyReportAccessError(doc,node,0x29c);
      return;
    }
  }
  return;
}

Assistant:

static void CheckInputAttributes( TidyDocImpl* doc, Node* node )
{
    Bool HasAlt = no;
    Bool MustHaveAlt = no;
    AttVal* av;

    /* Checks attributes within the INPUT element */
    for (av = node->attributes; av != NULL; av = av->next)
    {
        /* 'VALUE' must be found if the 'TYPE' is 'text' or 'checkbox' */
        if ( attrIsTYPE(av) && hasValue(av) )
        {
            if (Level1_Enabled( doc ))
            {
                if (AttrValueIs(av, "image"))
                {
                    MustHaveAlt = yes;
                }
            }

        }

        if ( attrIsALT(av) && hasValue(av) )
        {
            HasAlt = yes;
        }
    }

    if ( MustHaveAlt && !HasAlt )
    {
        TY_(ReportAccessError)( doc, node, IMG_BUTTON_MISSING_ALT );
    }

}